

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O3

string * __thiscall
cmExtraCodeLiteGenerator::GetRebuildCommand_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraCodeLiteGenerator *this,cmMakefile *mf)

{
  ulong *puVar1;
  size_type *psVar2;
  undefined8 *puVar3;
  ulong uVar4;
  undefined8 uVar5;
  ulong *local_b8;
  long local_b0;
  ulong local_a8;
  undefined8 uStack_a0;
  string local_98;
  string local_78;
  string local_58;
  cmXMLSafe local_38;
  
  GetCleanCommand_abi_cxx11_(&local_58,this,mf);
  cmXMLSafe::cmXMLSafe(&local_38," && ");
  cmXMLSafe::str_abi_cxx11_(&local_78,&local_38);
  uVar5 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    uVar5 = local_58.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar5 < local_78._M_string_length + local_58._M_string_length) {
    uVar5 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      uVar5 = local_78.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar5 < local_78._M_string_length + local_58._M_string_length) goto LAB_003be53f;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_78,0,(char *)0x0,(ulong)local_58._M_dataplus._M_p);
  }
  else {
LAB_003be53f:
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_78._M_dataplus._M_p);
  }
  local_b8 = &local_a8;
  puVar1 = puVar3 + 2;
  if ((ulong *)*puVar3 == puVar1) {
    local_a8 = *puVar1;
    uStack_a0 = puVar3[3];
  }
  else {
    local_a8 = *puVar1;
    local_b8 = (ulong *)*puVar3;
  }
  local_b0 = puVar3[1];
  *puVar3 = puVar1;
  puVar3[1] = 0;
  *(undefined1 *)puVar1 = 0;
  GetBuildCommand_abi_cxx11_(&local_98,this,mf);
  uVar4 = 0xf;
  if (local_b8 != &local_a8) {
    uVar4 = local_a8;
  }
  if (uVar4 < local_98._M_string_length + local_b0) {
    uVar5 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      uVar5 = local_98.field_2._M_allocated_capacity;
    }
    if (local_98._M_string_length + local_b0 <= (ulong)uVar5) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_b8);
      goto LAB_003be60f;
    }
  }
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_98._M_dataplus._M_p);
LAB_003be60f:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar2 = puVar3 + 2;
  if ((size_type *)*puVar3 == psVar2) {
    uVar5 = puVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar2;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar5;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar2;
  }
  __return_storage_ptr__->_M_string_length = puVar3[1];
  *puVar3 = psVar2;
  puVar3[1] = 0;
  *(undefined1 *)psVar2 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,local_a8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
cmExtraCodeLiteGenerator::GetRebuildCommand(const cmMakefile* mf) const
{
  return GetCleanCommand(mf) + cmXMLSafe(" && ").str() + GetBuildCommand(mf);
}